

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.h
# Opt level: O1

Object * flatbuffers::GetUnionType(Schema *schema,Object *parent,Field *unionfield,Table *table)

{
  uint uVar1;
  uchar uVar2;
  ushort uVar3;
  uint8_t *offset_location;
  long lVar4;
  ulong uVar5;
  long *plVar6;
  uint *puVar7;
  long *plVar8;
  int *piVar9;
  char *__function;
  uint uVar10;
  Field *pFVar11;
  unsigned_short vtsize;
  Schema *pSVar12;
  Schema *pSVar13;
  Object *pOVar14;
  long *local_80;
  long local_78;
  long local_70;
  long lStack_68;
  Table *local_60;
  long *local_58 [2];
  long local_48 [2];
  long *local_38;
  
  if (*(ushort *)(schema + -(long)*(int *)schema) < 7) {
    uVar3 = 0;
  }
  else {
    uVar3 = *(ushort *)(schema + (6 - (long)*(int *)schema));
  }
  if (uVar3 == 0) {
    pSVar12 = (Schema *)0x0;
  }
  else {
    pSVar12 = schema + (ulong)*(uint *)(schema + uVar3) + (ulong)uVar3;
  }
  lVar4 = -(long)*(int *)unionfield;
  if (*(ushort *)(unionfield + -(long)*(int *)unionfield) < 7) {
    uVar3 = 0;
  }
  else {
    uVar3 = *(ushort *)(unionfield + lVar4 + 6);
  }
  if (uVar3 == 0) {
    pFVar11 = (Field *)0x0;
  }
  else {
    pFVar11 = unionfield + (ulong)*(uint *)(unionfield + uVar3) + (ulong)uVar3;
  }
  if (*(ushort *)(pFVar11 + -(long)*(int *)pFVar11) < 9) {
    uVar3 = 0;
  }
  else {
    uVar3 = *(ushort *)(pFVar11 + (8 - (long)*(int *)pFVar11));
  }
  if (uVar3 == 0) {
    uVar10 = 0xffffffff;
  }
  else {
    uVar10 = *(uint *)(pFVar11 + uVar3);
  }
  if (uVar10 < *(uint *)pSVar12) {
    if (*(ushort *)(parent + -(long)*(int *)parent) < 7) {
      uVar3 = 0;
    }
    else {
      uVar3 = *(ushort *)(parent + (6 - (long)*(int *)parent));
    }
    if (uVar3 == 0) {
      pOVar14 = (Object *)0x0;
    }
    else {
      pOVar14 = parent + (ulong)*(uint *)(parent + uVar3) + (ulong)uVar3;
    }
    if (*(ushort *)(unionfield + -(long)*(int *)unionfield) < 5) {
      uVar3 = 0;
    }
    else {
      uVar3 = *(ushort *)(unionfield + lVar4 + 4);
    }
    uVar1 = *(uint *)(pSVar12 + (ulong)(uVar10 << 2) + 4);
    uVar5 = (ulong)uVar3;
    local_58[0] = local_48;
    local_60 = table;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_58,unionfield + (ulong)*(uint *)(unionfield + uVar5) + 4 + uVar5,
               unionfield +
               (ulong)*(uint *)(unionfield + (ulong)*(uint *)(unionfield + uVar5) + 4 + uVar5 + -4)
               + *(uint *)(unionfield + uVar5) + uVar5 + 4);
    plVar6 = (long *)std::__cxx11::string::append((char *)local_58);
    plVar8 = plVar6 + 2;
    if ((long *)*plVar6 == plVar8) {
      local_70 = *plVar8;
      lStack_68 = plVar6[3];
      local_80 = &local_70;
    }
    else {
      local_70 = *plVar8;
      local_80 = (long *)*plVar6;
    }
    local_78 = plVar6[1];
    *plVar6 = (long)plVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    local_38 = local_80;
    puVar7 = (uint *)bsearch(&local_38,pOVar14 + 4,(ulong)*(uint *)pOVar14,4,
                             Vector<flatbuffers::Offset<reflection::Field>,unsigned_int>::
                             KeyCompare<char_const*>);
    if (puVar7 == (uint *)0x0) {
      pFVar11 = (Field *)0x0;
    }
    else {
      pFVar11 = (Field *)((ulong)*puVar7 + (long)puVar7);
    }
    if (local_80 != &local_70) {
      operator_delete(local_80,local_70 + 1);
    }
    if (local_58[0] != local_48) {
      operator_delete(local_58[0],local_48[0] + 1);
    }
    if (pFVar11 == (Field *)0x0) {
      __assert_fail("type_field",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/include/flatbuffers/reflection.h"
                    ,0x1ac,
                    "const reflection::Object &flatbuffers::GetUnionType(const reflection::Schema &, const reflection::Object &, const reflection::Field &, const Table &)"
                   );
    }
    lVar4 = (ulong)uVar1 + (ulong)(uVar10 << 2);
    pSVar13 = pSVar12 + lVar4 + 4;
    uVar2 = GetFieldI<unsigned_char>(local_60,pFVar11);
    if (*(ushort *)(pSVar13 + -(long)*(int *)pSVar13) < 7) {
      uVar3 = 0;
    }
    else {
      uVar3 = *(ushort *)(pSVar12 + ((lVar4 + 10) - (long)*(int *)pSVar13));
    }
    local_80 = (long *)CONCAT71(local_80._1_7_,uVar2);
    puVar7 = (uint *)bsearch(&local_80,
                             pSVar13 + (ulong)*(uint *)(pSVar13 + uVar3) + 4 + (ulong)uVar3,
                             (ulong)*(uint *)(pSVar13 + (ulong)*(uint *)(pSVar13 + uVar3) + 4 +
                                                        (ulong)uVar3 + -4),4,
                             Vector<flatbuffers::Offset<reflection::EnumVal>,_unsigned_int>::
                             KeyCompare<unsigned_char>);
    if (puVar7 == (uint *)0x0) {
      piVar9 = (int *)0x0;
    }
    else {
      piVar9 = (int *)((ulong)*puVar7 + (long)puVar7);
    }
    if (*(ushort *)(schema + -(long)*(int *)schema) < 5) {
      uVar3 = 0;
    }
    else {
      uVar3 = *(ushort *)(schema + (4 - (long)*(int *)schema));
    }
    if (uVar3 == 0) {
      pSVar12 = (Schema *)0x0;
    }
    else {
      pSVar12 = schema + (ulong)*(uint *)(schema + uVar3) + (ulong)uVar3;
    }
    if (*(ushort *)((long)piVar9 - (long)*piVar9) < 0xb) {
      uVar3 = 0;
    }
    else {
      uVar3 = *(ushort *)((long)piVar9 + (10 - (long)*piVar9));
    }
    if (uVar3 == 0) {
      piVar9 = (int *)0x0;
    }
    else {
      piVar9 = (int *)((long)piVar9 + (ulong)*(uint *)((long)piVar9 + (ulong)uVar3) + (ulong)uVar3);
    }
    if (*(ushort *)((long)piVar9 - (long)*piVar9) < 9) {
      uVar3 = 0;
    }
    else {
      uVar3 = *(ushort *)((long)piVar9 + (8 - (long)*piVar9));
    }
    if (uVar3 == 0) {
      uVar10 = 0xffffffff;
    }
    else {
      uVar10 = *(uint *)((long)piVar9 + (ulong)uVar3);
    }
    if (uVar10 < *(uint *)pSVar12) {
      return (Object *)
             (pSVar12 +
             (ulong)*(uint *)(pSVar12 + (ulong)(uVar10 << 2) + 4) + (ulong)(uVar10 << 2) + 4);
    }
    __function = 
    "return_type flatbuffers::Vector<flatbuffers::Offset<reflection::Object>>::Get(SizeT) const [T = flatbuffers::Offset<reflection::Object>, SizeT = unsigned int]"
    ;
  }
  else {
    __function = 
    "return_type flatbuffers::Vector<flatbuffers::Offset<reflection::Enum>>::Get(SizeT) const [T = flatbuffers::Offset<reflection::Enum>, SizeT = unsigned int]"
    ;
  }
  __assert_fail("i < size()",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/include/flatbuffers/vector.h"
                ,0xc1,__function);
}

Assistant:

inline const reflection::Object &GetUnionType(
    const reflection::Schema &schema, const reflection::Object &parent,
    const reflection::Field &unionfield, const Table &table) {
  auto enumdef = schema.enums()->Get(unionfield.type()->index());
  // TODO: this is clumsy and slow, but no other way to find it?
  auto type_field = parent.fields()->LookupByKey(
      (unionfield.name()->str() + UnionTypeFieldSuffix()).c_str());
  FLATBUFFERS_ASSERT(type_field);
  auto union_type = GetFieldI<uint8_t>(table, *type_field);
  auto enumval = enumdef->values()->LookupByKey(union_type);
  return *schema.objects()->Get(enumval->union_type()->index());
}